

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCLocaleEnvironmentScope.cxx
# Opt level: O2

void __thiscall
cmCLocaleEnvironmentScope::SetEnv(cmCLocaleEnvironmentScope *this,string *key,string *value)

{
  ostream *poVar1;
  string oldValue;
  ostringstream tmp;
  string sStack_1d8;
  string local_1b8;
  ostream local_198;
  
  GetEnv(&local_1b8,(cmCLocaleEnvironmentScope *)key,key);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_198,key,&local_1b8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_198);
  if (value->_M_string_length == 0) {
    cmSystemTools::UnsetEnv((key->_M_dataplus)._M_p);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    poVar1 = std::operator<<(&local_198,(string *)key);
    poVar1 = std::operator<<(poVar1,"=");
    std::operator<<(poVar1,(string *)value);
    std::__cxx11::stringbuf::str();
    cmsys::SystemTools::PutEnv(&sStack_1d8);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void cmCLocaleEnvironmentScope::SetEnv(std::string const& key,
                                       std::string const& value)
{
  std::string oldValue = this->GetEnv(key);

  this->EnvironmentBackup.insert(std::make_pair(key, oldValue));

  if (value.empty()) {
    cmSystemTools::UnsetEnv(key.c_str());
  } else {
    std::ostringstream tmp;
    tmp << key << "=" << value;
    cmSystemTools::PutEnv(tmp.str());
  }
}